

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O0

void Gia_ManFalseRebuildOne
               (Gia_Man_t *pNew,Gia_Man_t *p,Vec_Int_t *vHook,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  uint local_74;
  uint local_4c;
  int iObjValue;
  int iPrevValue;
  int CtrlValue;
  int i;
  Gia_Obj_t *pPrev;
  Gia_Obj_t *pObj1;
  Gia_Obj_t *pObj;
  int fVeryVerbose_local;
  int fVerbose_local;
  Vec_Int_t *vHook_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  _CtrlValue = (Gia_Obj_t *)0x0;
  local_4c = 0xffffffff;
  iVar1 = Vec_IntEntry(vHook,0);
  pObj1 = Gia_ManObj(p,iVar1);
  iVar1 = Vec_IntSize(vHook);
  if (iVar1 == 1) {
    pObj1->Value = 0;
  }
  else {
    iVar1 = Vec_IntSize(vHook);
    if (iVar1 < 2) {
      __assert_fail("Vec_IntSize(vHook) >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFalse.c"
                    ,0x3a,
                    "void Gia_ManFalseRebuildOne(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int, int)");
    }
    iVar1 = Vec_IntEntry(vHook,1);
    pObj_00 = Gia_ManObj(p,iVar1);
    pGVar3 = Gia_ObjFanin0(pObj_00);
    if (pGVar3 == pObj1) {
      iObjValue = Gia_ObjFaninC0(pObj_00);
    }
    else {
      pGVar3 = Gia_ObjFanin1(pObj_00);
      if (pGVar3 != pObj1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFalse.c"
                      ,0x41,
                      "void Gia_ManFalseRebuildOne(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int, int)"
                     );
      }
      iObjValue = Gia_ObjFaninC1(pObj_00);
    }
    iPrevValue = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vHook);
      bVar4 = false;
      if (iPrevValue < iVar1) {
        iVar1 = Vec_IntEntry(vHook,iPrevValue);
        pObj1 = Gia_ManObj(p,iVar1);
        bVar4 = pObj1 != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      uVar2 = pObj1->Value;
      if (iPrevValue == 0) {
        local_74 = iObjValue;
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(pObj1);
        iLit1 = Gia_ObjFanin1Copy(pObj1);
        local_74 = Gia_ManHashAnd(pNew,iVar1,iLit1);
      }
      pObj1->Value = local_74;
      if (_CtrlValue != (Gia_Obj_t *)0x0) {
        _CtrlValue->Value = local_4c;
      }
      _CtrlValue = pObj1;
      iPrevValue = iPrevValue + 1;
      local_4c = uVar2;
    }
    if (fVeryVerbose != 0) {
      printf("Eliminated path: ");
      Vec_IntPrint(vHook);
      iPrevValue = 0;
      while( true ) {
        iVar1 = Vec_IntSize(vHook);
        bVar4 = false;
        if (iPrevValue < iVar1) {
          iVar1 = Vec_IntEntry(vHook,iPrevValue);
          pObj1 = Gia_ManObj(p,iVar1);
          bVar4 = pObj1 != (Gia_Obj_t *)0x0;
        }
        if (!bVar4) break;
        uVar2 = Gia_ObjLevel(p,pObj1);
        printf("Level %3d : ",(ulong)uVar2);
        Gia_ObjPrint(p,pObj1);
        iPrevValue = iPrevValue + 1;
      }
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reconstruct the AIG after detecting false paths.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManFalseRebuildOne( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Int_t * vHook, int fVerbose, int fVeryVerbose )
{
    Gia_Obj_t * pObj, * pObj1, * pPrev = NULL;
    int i, CtrlValue = 0, iPrevValue = -1;
    pObj = Gia_ManObj( p, Vec_IntEntry(vHook, 0) );
    if ( Vec_IntSize(vHook) == 1 )
    {
        pObj->Value = 0; // what if stuck at 1???
        return;
    }
    assert( Vec_IntSize(vHook) >= 2 );
    // find controlling value
    pObj1 = Gia_ManObj( p, Vec_IntEntry(vHook, 1) );
    if ( Gia_ObjFanin0(pObj1) == pObj )
        CtrlValue = Gia_ObjFaninC0(pObj1);
    else if ( Gia_ObjFanin1(pObj1) == pObj )
        CtrlValue = Gia_ObjFaninC1(pObj1);
    else assert( 0 );
//    printf( "%d ", CtrlValue );
    // rewrite the path
    Gia_ManForEachObjVec( vHook, p, pObj, i )
    {
        int iObjValue = pObj->Value;
        pObj->Value = i ? Gia_ManHashAnd(pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj)) : CtrlValue;
        if ( pPrev )
            pPrev->Value = iPrevValue;
        iPrevValue = iObjValue;
        pPrev = pObj;
    }
    if ( fVeryVerbose )
    {
        printf( "Eliminated path: " );
        Vec_IntPrint( vHook );
        Gia_ManForEachObjVec( vHook, p, pObj, i )
        {
            printf( "Level %3d : ", Gia_ObjLevel(p, pObj) );
            Gia_ObjPrint( p, pObj );
        }
    }
}